

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O3

void __thiscall Fverb::process(Fverb *this,float *in0,float *in1,float *out0,float *out1,uint count)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  _Head_base<0UL,_Fverb::BasicDsp_*,_false> _Var13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  uint uVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  uint uVar41;
  float fVar42;
  float fVar43;
  uint uVar44;
  uint uVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  
  _Var13._M_head_impl =
       (this->fDsp)._M_t.
       super___uniq_ptr_impl<Fverb::BasicDsp,_std::default_delete<Fverb::BasicDsp>_>._M_t.
       super__Tuple_impl<0UL,_Fverb::BasicDsp_*,_std::default_delete<Fverb::BasicDsp>_>.
       super__Head_base<0UL,_Fverb::BasicDsp_*,_false>._M_head_impl;
  fVar1 = *(float *)&_Var13._M_head_impl[2]._vptr_BasicDsp;
  fVar2 = *(float *)&_Var13._M_head_impl[3]._vptr_BasicDsp;
  fVar3 = *(float *)((long)(_Var13._M_head_impl + 2) + 4);
  fVar4 = *(float *)&_Var13._M_head_impl[5]._vptr_BasicDsp;
  fVar5 = *(float *)&_Var13._M_head_impl[0x10007]._vptr_BasicDsp;
  fVar6 = *(float *)((long)(_Var13._M_head_impl + 0x10007) + 4);
  fVar29 = *(float *)&_Var13._M_head_impl[0x10009]._vptr_BasicDsp;
  fVar27 = expf((*(float *)((long)(_Var13._M_head_impl + 0x10009) + 4) * -6.2831855 + 0.0) * fVar29)
  ;
  fVar28 = expf((*(float *)&_Var13._M_head_impl[0x1000c]._vptr_BasicDsp * -6.2831855 + 0.0) * fVar29
               );
  fVar7 = *(float *)((long)(_Var13._M_head_impl + 0x1000e) + 4);
  fVar8 = *(float *)&_Var13._M_head_impl[0x10413]._vptr_BasicDsp;
  fVar9 = *(float *)&_Var13._M_head_impl[0x11018]._vptr_BasicDsp;
  fVar10 = *(float *)((long)(_Var13._M_head_impl + 0x21019) + 4);
  fVar11 = *(float *)&_Var13._M_head_impl[0x2101b]._vptr_BasicDsp;
  fVar29 = expf((*(float *)(&DAT_00128120 + (long)_Var13._M_head_impl) * -6.2831855 + 0.0) * fVar29)
  ;
  if (0 < (int)count) {
    fVar46 = *(float *)((long)(_Var13._M_head_impl + 4) + 4);
    fVar30 = *(float *)&_Var13._M_head_impl[6]._vptr_BasicDsp;
    iVar12 = *(int *)((long)(_Var13._M_head_impl + 6) + 4);
    fVar32 = *(float *)((long)(_Var13._M_head_impl + 0x10008) + 4);
    fVar31 = *(float *)((long)(_Var13._M_head_impl + 0x1000a) + 4);
    fVar36 = *(float *)((long)(_Var13._M_head_impl + 0x1000b) + 4);
    fVar33 = *(float *)&_Var13._M_head_impl[0x1000d]._vptr_BasicDsp;
    fVar34 = *(float *)&_Var13._M_head_impl[0x1000e]._vptr_BasicDsp;
    fVar38 = *(float *)((long)(_Var13._M_head_impl + 0x1000f) + 4);
    fVar50 = *(float *)&_Var13._M_head_impl[0x10211]._vptr_BasicDsp;
    fVar40 = *(float *)((long)(_Var13._M_head_impl + 0x10412) + 4);
    fVar49 = *(float *)&_Var13._M_head_impl[0x10414]._vptr_BasicDsp;
    fVar39 = *(float *)((long)(_Var13._M_head_impl + 0x10c15) + 4);
    iVar20 = *(int *)&_Var13._M_head_impl[0x21022]._vptr_BasicDsp;
    iVar19 = *(int *)&_Var13._M_head_impl[0x54034]._vptr_BasicDsp;
    uVar17 = 0;
    iVar21 = *(int *)&_Var13._M_head_impl[0x21021]._vptr_BasicDsp;
    iVar18 = *(int *)&_Var13._M_head_impl[0x54033]._vptr_BasicDsp;
    do {
      uVar24 = iVar12 + (int)uVar17;
      fVar52 = *(float *)((long)(_Var13._M_head_impl + 3) + 4);
      fVar47 = fVar46 * fVar52 + fVar3 * fVar1;
      *(float *)&_Var13._M_head_impl[4]._vptr_BasicDsp = fVar47;
      fVar35 = fVar47 + 0.15;
      fVar48 = fVar30 * fVar52 + fVar4 * fVar1;
      *(float *)((long)(_Var13._M_head_impl + 5) + 4) = fVar48;
      uVar22 = (ulong)(uVar24 & 0x1ffff);
      *(float *)((long)(_Var13._M_head_impl + 7) + uVar22 * 4) = in1[uVar17] * fVar48;
      fVar30 = fVar32 * fVar52 + fVar6 * fVar5;
      *(float *)&_Var13._M_head_impl[0x10008]._vptr_BasicDsp = fVar30;
      fVar46 = *(float *)((long)(_Var13._M_head_impl + 1) + 4);
      iVar15 = (int)(fVar30 * fVar46);
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      if (0xffff < iVar15) {
        iVar15 = 0x10000;
      }
      fVar31 = fVar31 * fVar52 + fVar27 * fVar2;
      *(float *)&_Var13._M_head_impl[0x1000a]._vptr_BasicDsp = fVar31;
      uVar23 = (ulong)(uVar24 - iVar15 & 0x1ffff);
      fVar30 = fVar36 * fVar31 + *(float *)((long)(_Var13._M_head_impl + 7) + uVar23 * 4);
      *(float *)&_Var13._M_head_impl[0x1000b]._vptr_BasicDsp = fVar30;
      fVar43 = fVar33 * fVar52 + fVar28 * fVar2;
      *(float *)((long)(_Var13._M_head_impl + 0x1000c) + 4) = fVar43;
      fVar30 = fVar30 * (1.0 - fVar31) + fVar34 * fVar43;
      *(float *)((long)(_Var13._M_head_impl + 0x1000d) + 4) = fVar30;
      fVar42 = fVar43 + 1.0;
      fVar36 = fVar42 * -0.5 + 0.0;
      fVar51 = fVar38 * fVar52 + fVar7 * fVar1;
      *(float *)&_Var13._M_head_impl[0x1000f]._vptr_BasicDsp = fVar51;
      fVar30 = (fVar30 * fVar42 * 0.5 + fVar34 * fVar36) - fVar51 * fVar50;
      uVar25 = (ulong)(uVar24 & 0x3ff);
      *(float *)((long)(_Var13._M_head_impl + 0x10010) + uVar25 * 4) = fVar30;
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x10210) + 4) =
           *(undefined4 *)
            ((long)(_Var13._M_head_impl + 0x10010) +
            (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x10210]._vptr_BasicDsp & 0x3ff) * 4);
      fVar30 = (fVar30 * fVar51 + fVar50) - fVar51 * fVar40;
      *(float *)((long)(_Var13._M_head_impl + 0x10211) + 4U + uVar25 * 4) = fVar30;
      *(undefined4 *)&_Var13._M_head_impl[0x10412]._vptr_BasicDsp =
           *(undefined4 *)
            ((long)(_Var13._M_head_impl + 0x10211) + 4U +
            (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x10411) + 4) & 0x3ff) * 4);
      fVar49 = fVar49 * fVar52 + fVar8 * fVar1;
      *(float *)((long)(_Var13._M_head_impl + 0x10413) + 4) = fVar49;
      fVar32 = (fVar30 * fVar51 + fVar40) - fVar49 * fVar39;
      *(float *)((long)(_Var13._M_head_impl + 0x10414) + 4U + (ulong)(uVar24 & 0xfff) * 4) = fVar32;
      *(undefined4 *)&_Var13._M_head_impl[0x10c15]._vptr_BasicDsp =
           *(undefined4 *)
            ((long)(_Var13._M_head_impl + 0x10414) + 4U +
            (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x10c14) + 4) & 0xfff) * 4);
      fVar30 = *(float *)&_Var13._M_head_impl[0x11017]._vptr_BasicDsp;
      fVar33 = (fVar32 * fVar49 + fVar39) - fVar49 * fVar30;
      *(float *)((long)(_Var13._M_head_impl + 0x10c16) + (ulong)(uVar24 & 0x7ff) * 4) = fVar33;
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x11016) + 4) =
           *(undefined4 *)
            ((long)(_Var13._M_head_impl + 0x10c16) +
            (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x11016]._vptr_BasicDsp & 0x7ff) * 4);
      fVar38 = *(float *)&_Var13._M_head_impl[0x11019]._vptr_BasicDsp * fVar52 + fVar1 * fVar9;
      *(float *)((long)(_Var13._M_head_impl + 0x11018) + 4) = fVar38;
      fVar32 = *(float *)&_Var13._M_head_impl[0x21023]._vptr_BasicDsp;
      fVar30 = *(float *)((long)(_Var13._M_head_impl + 0x5a038) + 4U +
                         (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x11017) + 4) &
                                0x7fff) * 4) * fVar47 + fVar38 * fVar32 + fVar33 * fVar49 + fVar30;
      *(float *)((long)(_Var13._M_head_impl + 0x11019) + 4U + uVar22 * 4) = fVar30;
      fVar33 = *(float *)((long)(_Var13._M_head_impl + 0x2101a) + 4) * fVar52 + fVar5 * fVar10;
      *(float *)&_Var13._M_head_impl[0x2101a]._vptr_BasicDsp = fVar33;
      fVar34 = *(float *)&_Var13._M_head_impl[0x2101c]._vptr_BasicDsp * fVar52 + fVar11 * fVar2;
      *(float *)((long)(_Var13._M_head_impl + 0x2101b) + 4) = fVar34;
      fVar34 = fVar34 * *(float *)&_Var13._M_head_impl[0x10009]._vptr_BasicDsp +
               *(float *)&_Var13._M_head_impl[0x2101d]._vptr_BasicDsp;
      fVar34 = fVar34 - (float)(int)fVar34;
      *(float *)((long)(_Var13._M_head_impl + 0x2101c) + 4) = fVar34;
      iVar15 = (int)(((float)(&(anonymous_namespace)::ftbl0mydspSIG0)
                             [(int)(((0.25 - (float)(int)(fVar34 + 0.25)) + fVar34) * 65536.0)] *
                      fVar33 + 0.030509727) * fVar46) + -1;
      uVar37 = *(uint *)&_Var13._M_head_impl[0x2101e]._vptr_BasicDsp;
      uVar44 = uVar37;
      if (iVar15 == iVar20) {
        uVar44 = 0;
      }
      fVar40 = *(float *)&_Var13._M_head_impl[0x21020]._vptr_BasicDsp;
      uVar41 = *(uint *)((long)(_Var13._M_head_impl + 0x2101d) + 4);
      uVar44 = -(uint)(fVar40 == 1.0) & uVar44;
      iVar14 = iVar21;
      if (iVar15 != iVar20) {
        iVar14 = iVar15;
      }
      if (fVar40 < 1.0) {
        iVar14 = iVar21;
      }
      uVar45 = uVar41;
      if (iVar15 == iVar21) {
        uVar45 = uVar44;
      }
      uVar26 = -(uint)(*(float *)&_Var13._M_head_impl[0x2101f]._vptr_BasicDsp != 0.0);
      fVar39 = (float)(uVar26 & -(uint)(fVar40 < 1.0) &
                                (uint)*(float *)&_Var13._M_head_impl[0x2101f]._vptr_BasicDsp &
                                -(uint)(0.0 < fVar40) |
                      ~uVar26 & (~-(uint)(fVar40 == 0.0) & uVar44 | uVar45 & -(uint)(fVar40 == 0.0))
                      );
      *(float *)((long)(_Var13._M_head_impl + 0x2101e) + 4) = fVar39;
      fVar39 = fVar39 + fVar40;
      if (1.0 <= fVar39) {
        fVar39 = 1.0;
      }
      if (fVar39 <= 0.0) {
        fVar39 = 0.0;
      }
      *(float *)((long)(_Var13._M_head_impl + 0x2101f) + 4) = fVar39;
      if (iVar15 == iVar21) {
        iVar15 = iVar20;
      }
      if (fVar40 <= 0.0) {
        iVar20 = iVar15;
      }
      iVar21 = iVar14;
      if (0xffff < iVar14) {
        iVar21 = 0x10000;
      }
      if (iVar21 < 1) {
        iVar21 = 0;
      }
      fVar40 = *(float *)((long)(_Var13._M_head_impl + 0x11019) + 4U +
                         (ulong)(uVar24 - iVar21 & 0x1ffff) * 4);
      iVar21 = iVar20;
      if (0xffff < iVar20) {
        iVar21 = 0x10000;
      }
      if (fVar35 <= 0.25) {
        fVar35 = 0.25;
      }
      if (0.5 <= fVar35) {
        fVar35 = 0.5;
      }
      if (iVar21 < 1) {
        iVar21 = 0;
      }
      *(float *)((long)(_Var13._M_head_impl + 0x21022) + 4) =
           fVar39 * (*(float *)((long)(_Var13._M_head_impl + 0x11019) + 4U +
                               (ulong)(uVar24 - iVar21 & 0x1ffff) * 4) - fVar40) + fVar40;
      fVar32 = fVar32 + (0.0 - fVar30 * fVar38);
      uVar16 = (ulong)(uVar24 & 0x7fff);
      *(float *)((long)(_Var13._M_head_impl + 0x21023) + 4U + uVar16 * 4) = fVar32;
      fVar52 = fVar52 * *(float *)(&DAT_00128128 + (long)_Var13._M_head_impl) + fVar29 * fVar2;
      *(float *)(&DAT_00128124 + (long)_Var13._M_head_impl) = fVar52;
      fVar40 = *(float *)(&DAT_00128130 + (long)_Var13._M_head_impl) * fVar52 +
               *(float *)((long)(_Var13._M_head_impl + 0x21023) + 4U +
                         (ulong)(uVar24 - *(int *)(&DAT_0012811c + (long)_Var13._M_head_impl) &
                                0x7fff) * 4);
      *(float *)(&DAT_0012812c + (long)_Var13._M_head_impl) = fVar40;
      fVar50 = 1.0 - fVar52;
      fVar30 = *(float *)(&DAT_0014813c + (long)_Var13._M_head_impl);
      fVar39 = fVar35 * fVar30 + fVar47 * fVar40 * fVar50;
      *(float *)(&DAT_00128134 + (long)&(_Var13._M_head_impl)->_vptr_BasicDsp + uVar16 * 4) = fVar39
      ;
      *(undefined4 *)(&DAT_00148138 + (long)_Var13._M_head_impl) =
           *(undefined4 *)
            (&DAT_00128134 +
            (long)&(_Var13._M_head_impl)->_vptr_BasicDsp +
            (ulong)(uVar24 - *(int *)(&DAT_00148134 + (long)_Var13._M_head_impl) & 0x7fff) * 4);
      *(float *)(&DAT_00148140 + (long)&(_Var13._M_head_impl)->_vptr_BasicDsp + uVar16 * 4) =
           (0.0 - fVar39 * fVar35) + fVar30;
      *(float *)((long)(_Var13._M_head_impl + 0x2d028) + (ulong)(uVar24 & 0x3fff) * 4) =
           fVar40 * fVar50;
      *(float *)((long)(_Var13._M_head_impl + 0x2f028) + uVar16 * 4) = fVar32;
      *(float *)((long)(_Var13._M_head_impl + 0x33028) + uVar22 * 4) = fVar48 * in0[uVar17];
      fVar30 = fVar31 * *(float *)((long)(_Var13._M_head_impl + 0x43028) + 4) +
               *(float *)((long)(_Var13._M_head_impl + 0x33028) + uVar23 * 4);
      *(float *)&_Var13._M_head_impl[0x43028]._vptr_BasicDsp = fVar30;
      fVar32 = (1.0 - fVar31) * fVar30 +
               fVar43 * *(float *)((long)(_Var13._M_head_impl + 0x43029) + 4);
      *(float *)&_Var13._M_head_impl[0x43029]._vptr_BasicDsp = fVar32;
      fVar30 = *(float *)&_Var13._M_head_impl[0x4322b]._vptr_BasicDsp;
      fVar31 = (fVar42 * fVar32 * 0.5 +
               fVar36 * *(float *)((long)(_Var13._M_head_impl + 0x43029) + 4)) - fVar51 * fVar30;
      *(float *)((long)(_Var13._M_head_impl + 0x4302a) + uVar25 * 4) = fVar31;
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x4322a) + 4) =
           *(undefined4 *)
            ((long)(_Var13._M_head_impl + 0x4302a) +
            (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x4322a]._vptr_BasicDsp & 0x3ff) * 4);
      fVar32 = *(float *)((long)(_Var13._M_head_impl + 0x4342c) + 4);
      fVar31 = (fVar31 * fVar51 + fVar30) - fVar51 * fVar32;
      *(float *)((long)(_Var13._M_head_impl + 0x4322b) + 4U + uVar25 * 4) = fVar31;
      *(undefined4 *)&_Var13._M_head_impl[0x4342c]._vptr_BasicDsp =
           *(undefined4 *)
            ((long)(_Var13._M_head_impl + 0x4322b) + 4U +
            (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x4342b) + 4) & 0x3ff) * 4);
      fVar30 = *(float *)&_Var13._M_head_impl[0x43c2e]._vptr_BasicDsp;
      fVar31 = (fVar31 * fVar51 + fVar32) - fVar49 * fVar30;
      *(float *)((long)(_Var13._M_head_impl + 0x4342d) + (ulong)(uVar24 & 0xfff) * 4) = fVar31;
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x43c2d) + 4) =
           *(undefined4 *)
            ((long)(_Var13._M_head_impl + 0x4342d) +
            (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x43c2d]._vptr_BasicDsp & 0xfff) * 4);
      fVar32 = *(float *)((long)(_Var13._M_head_impl + 0x4402f) + 4);
      fVar31 = (fVar31 * fVar49 + fVar30) - fVar49 * fVar32;
      *(float *)((long)(_Var13._M_head_impl + 0x43c2e) + 4U + (ulong)(uVar24 & 0x7ff) * 4) = fVar31;
      *(undefined4 *)&_Var13._M_head_impl[0x4402f]._vptr_BasicDsp =
           *(undefined4 *)
            ((long)(_Var13._M_head_impl + 0x43c2e) + 4U +
            (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x4402e) + 4) & 0x7ff) * 4);
      fVar30 = *(float *)&_Var13._M_head_impl[0x54035]._vptr_BasicDsp;
      fVar32 = *(float *)(&DAT_00148140 +
                         (long)&(_Var13._M_head_impl)->_vptr_BasicDsp +
                         (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x44030]._vptr_BasicDsp &
                                0x7fff) * 4) * fVar47 + fVar38 * fVar30 + fVar31 * fVar49 + fVar32;
      *(float *)((long)(_Var13._M_head_impl + 0x44030) + 4U + uVar22 * 4) = fVar32;
      iVar21 = (int)(fVar46 * (fVar33 * (float)(&(anonymous_namespace)::ftbl0mydspSIG0)
                                               [(int)(fVar34 * 65536.0)] + 0.025603978)) + -1;
      if (iVar21 == iVar19) {
        uVar37 = 0;
      }
      fVar46 = *(float *)&_Var13._M_head_impl[0x54032]._vptr_BasicDsp;
      iVar15 = iVar18;
      if (iVar21 != iVar19) {
        iVar15 = iVar21;
      }
      uVar37 = -(uint)(fVar46 == 1.0) & uVar37;
      if (fVar46 < 1.0) {
        iVar15 = iVar18;
      }
      if (iVar21 == iVar18) {
        uVar41 = uVar37;
      }
      uVar44 = -(uint)(*(float *)&_Var13._M_head_impl[0x54031]._vptr_BasicDsp != 0.0);
      fVar31 = (float)(uVar44 & -(uint)(fVar46 < 1.0) &
                                (uint)*(float *)&_Var13._M_head_impl[0x54031]._vptr_BasicDsp &
                                -(uint)(0.0 < fVar46) |
                      ~uVar44 & (~-(uint)(fVar46 == 0.0) & uVar37 | uVar41 & -(uint)(fVar46 == 0.0))
                      );
      *(float *)((long)(_Var13._M_head_impl + 0x54030) + 4) = fVar31;
      fVar31 = fVar31 + fVar46;
      if (1.0 <= fVar31) {
        fVar31 = 1.0;
      }
      if (fVar31 <= 0.0) {
        fVar31 = 0.0;
      }
      *(float *)((long)(_Var13._M_head_impl + 0x54031) + 4) = fVar31;
      if (iVar21 == iVar18) {
        iVar21 = iVar19;
      }
      if (fVar46 <= 0.0) {
        iVar19 = iVar21;
      }
      iVar21 = iVar15;
      if (0xffff < iVar15) {
        iVar21 = 0x10000;
      }
      if (iVar21 < 1) {
        iVar21 = 0;
      }
      fVar46 = *(float *)((long)(_Var13._M_head_impl + 0x44030) + 4U +
                         (ulong)(uVar24 - iVar21 & 0x1ffff) * 4);
      iVar21 = iVar19;
      if (0xffff < iVar19) {
        iVar21 = 0x10000;
      }
      if (iVar21 < 1) {
        iVar21 = 0;
      }
      *(float *)((long)(_Var13._M_head_impl + 0x54034) + 4) =
           fVar31 * (*(float *)((long)(_Var13._M_head_impl + 0x44030) + 4U +
                               (ulong)(uVar24 - iVar21 & 0x1ffff) * 4) - fVar46) + fVar46;
      fVar30 = fVar30 + (0.0 - fVar38 * fVar32);
      *(float *)((long)(_Var13._M_head_impl + 0x54035) + 4U + uVar16 * 4) = fVar30;
      fVar31 = fVar52 * *(float *)((long)(_Var13._M_head_impl + 0x58036) + 4) +
               *(float *)((long)(_Var13._M_head_impl + 0x54035) + 4U +
                         (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x58035) + 4) &
                                0x7fff) * 4);
      *(float *)&_Var13._M_head_impl[0x58036]._vptr_BasicDsp = fVar31;
      fVar46 = *(float *)&_Var13._M_head_impl[0x5a038]._vptr_BasicDsp;
      fVar32 = fVar35 * fVar46 + fVar47 * fVar50 * fVar31;
      *(float *)((long)(_Var13._M_head_impl + 0x58037) + (ulong)(uVar24 & 0x3fff) * 4) = fVar32;
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x5a037) + 4) =
           *(undefined4 *)
            ((long)(_Var13._M_head_impl + 0x58037) +
            (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x5a037]._vptr_BasicDsp & 0x3fff) * 4);
      *(float *)((long)(_Var13._M_head_impl + 0x5a038) + 4U + uVar16 * 4) =
           (0.0 - fVar32 * fVar35) + fVar46;
      *(float *)((long)(_Var13._M_head_impl + 0x5e038) + 4U + (ulong)(uVar24 & 0x1fff) * 4) =
           fVar31 * fVar50;
      *(float *)((long)(_Var13._M_head_impl + 0x5f038) + 4U + uVar16 * 4) = fVar30;
      out0[uVar17] = ((*(float *)((long)(_Var13._M_head_impl + 0x2f028) +
                                 (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x63038) + 4
                                                          ) & 0x7fff) * 4) +
                       *(float *)((long)(_Var13._M_head_impl + 0x2f028) +
                                 (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x63039].
                                                           _vptr_BasicDsp & 0x7fff) * 4) +
                      *(float *)(&DAT_00148140 +
                                (long)&(_Var13._M_head_impl)->_vptr_BasicDsp +
                                (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x63039) + 4)
                                       & 0x7fff) * 4)) -
                     (*(float *)((long)(_Var13._M_head_impl + 0x2d028) +
                                (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x6303a].
                                                          _vptr_BasicDsp & 0x3fff) * 4) +
                      *(float *)((long)(_Var13._M_head_impl + 0x5f038) + 4U +
                                (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x6303a) + 4)
                                       & 0x7fff) * 4) +
                      *(float *)((long)(_Var13._M_head_impl + 0x5e038) + 4U +
                                (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x6303b].
                                                          _vptr_BasicDsp & 0x1fff) * 4) +
                     *(float *)((long)(_Var13._M_head_impl + 0x5a038) + 4U +
                               (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x6303b) + 4)
                                      & 0x7fff) * 4))) * 0.6;
      out1[uVar17] = ((*(float *)((long)(_Var13._M_head_impl + 0x5f038) + 4U +
                                 (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x6303c].
                                                           _vptr_BasicDsp & 0x7fff) * 4) +
                       *(float *)((long)(_Var13._M_head_impl + 0x5f038) + 4U +
                                 (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x6303c) + 4
                                                          ) & 0x7fff) * 4) +
                      *(float *)((long)(_Var13._M_head_impl + 0x5a038) + 4U +
                                (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x6303d].
                                                          _vptr_BasicDsp & 0x7fff) * 4)) -
                     (*(float *)((long)(_Var13._M_head_impl + 0x5e038) + 4U +
                                (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x6303d) + 4)
                                       & 0x1fff) * 4) +
                      *(float *)((long)(_Var13._M_head_impl + 0x2f028) +
                                (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x6303e].
                                                          _vptr_BasicDsp & 0x7fff) * 4) +
                      *(float *)((long)(_Var13._M_head_impl + 0x2d028) +
                                (ulong)(uVar24 - *(int *)((long)(_Var13._M_head_impl + 0x6303e) + 4)
                                       & 0x3fff) * 4) +
                     *(float *)(&DAT_00148140 +
                               (long)&(_Var13._M_head_impl)->_vptr_BasicDsp +
                               (ulong)(uVar24 - *(int *)&_Var13._M_head_impl[0x6303f]._vptr_BasicDsp
                                      & 0x7fff) * 4))) * 0.6;
      fVar46 = *(float *)&_Var13._M_head_impl[4]._vptr_BasicDsp;
      fVar30 = *(float *)((long)(_Var13._M_head_impl + 5) + 4);
      *(float *)((long)(_Var13._M_head_impl + 4) + 4) = fVar46;
      *(float *)&_Var13._M_head_impl[6]._vptr_BasicDsp = fVar30;
      fVar32 = *(float *)&_Var13._M_head_impl[0x10008]._vptr_BasicDsp;
      *(float *)((long)(_Var13._M_head_impl + 0x10008) + 4) = fVar32;
      fVar31 = *(float *)&_Var13._M_head_impl[0x1000a]._vptr_BasicDsp;
      *(float *)((long)(_Var13._M_head_impl + 0x1000a) + 4) = fVar31;
      fVar36 = *(float *)&_Var13._M_head_impl[0x1000b]._vptr_BasicDsp;
      *(float *)((long)(_Var13._M_head_impl + 0x1000b) + 4) = fVar36;
      fVar33 = *(float *)((long)(_Var13._M_head_impl + 0x1000c) + 4);
      *(float *)&_Var13._M_head_impl[0x1000d]._vptr_BasicDsp = fVar33;
      fVar34 = *(float *)((long)(_Var13._M_head_impl + 0x1000d) + 4);
      *(float *)&_Var13._M_head_impl[0x1000e]._vptr_BasicDsp = fVar34;
      fVar38 = *(float *)&_Var13._M_head_impl[0x1000f]._vptr_BasicDsp;
      *(float *)((long)(_Var13._M_head_impl + 0x1000f) + 4) = fVar38;
      fVar50 = *(float *)((long)(_Var13._M_head_impl + 0x10210) + 4);
      *(float *)&_Var13._M_head_impl[0x10211]._vptr_BasicDsp = fVar50;
      fVar40 = *(float *)&_Var13._M_head_impl[0x10412]._vptr_BasicDsp;
      *(float *)((long)(_Var13._M_head_impl + 0x10412) + 4) = fVar40;
      fVar49 = *(float *)((long)(_Var13._M_head_impl + 0x10413) + 4);
      *(float *)&_Var13._M_head_impl[0x10414]._vptr_BasicDsp = fVar49;
      fVar39 = *(float *)&_Var13._M_head_impl[0x10c15]._vptr_BasicDsp;
      *(float *)((long)(_Var13._M_head_impl + 0x10c15) + 4) = fVar39;
      *(undefined4 *)&_Var13._M_head_impl[0x11017]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x11016) + 4);
      *(undefined4 *)&_Var13._M_head_impl[0x11019]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x11018) + 4);
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x2101a) + 4) =
           *(undefined4 *)&_Var13._M_head_impl[0x2101a]._vptr_BasicDsp;
      *(undefined4 *)&_Var13._M_head_impl[0x2101c]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x2101b) + 4);
      *(undefined4 *)&_Var13._M_head_impl[0x2101d]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x2101c) + 4);
      *(undefined4 *)&_Var13._M_head_impl[0x2101f]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x2101e) + 4);
      *(undefined4 *)&_Var13._M_head_impl[0x21020]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x2101f) + 4);
      *(undefined4 *)&_Var13._M_head_impl[0x21023]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x21022) + 4);
      *(undefined4 *)(&DAT_00128128 + (long)_Var13._M_head_impl) =
           *(undefined4 *)(&DAT_00128124 + (long)_Var13._M_head_impl);
      *(undefined4 *)(&DAT_00128130 + (long)_Var13._M_head_impl) =
           *(undefined4 *)(&DAT_0012812c + (long)_Var13._M_head_impl);
      *(undefined4 *)(&DAT_0014813c + (long)_Var13._M_head_impl) =
           *(undefined4 *)(&DAT_00148138 + (long)_Var13._M_head_impl);
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x43028) + 4) =
           *(undefined4 *)&_Var13._M_head_impl[0x43028]._vptr_BasicDsp;
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x43029) + 4) =
           *(undefined4 *)&_Var13._M_head_impl[0x43029]._vptr_BasicDsp;
      *(undefined4 *)&_Var13._M_head_impl[0x4322b]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x4322a) + 4);
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x4342c) + 4) =
           *(undefined4 *)&_Var13._M_head_impl[0x4342c]._vptr_BasicDsp;
      *(undefined4 *)&_Var13._M_head_impl[0x43c2e]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x43c2d) + 4);
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x4402f) + 4) =
           *(undefined4 *)&_Var13._M_head_impl[0x4402f]._vptr_BasicDsp;
      *(undefined4 *)&_Var13._M_head_impl[0x54031]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x54030) + 4);
      *(undefined4 *)&_Var13._M_head_impl[0x54032]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x54031) + 4);
      *(undefined4 *)&_Var13._M_head_impl[0x54035]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x54034) + 4);
      *(undefined4 *)((long)(_Var13._M_head_impl + 0x58036) + 4) =
           *(undefined4 *)&_Var13._M_head_impl[0x58036]._vptr_BasicDsp;
      *(undefined4 *)&_Var13._M_head_impl[0x5a038]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var13._M_head_impl + 0x5a037) + 4);
      uVar17 = uVar17 + 1;
      iVar21 = iVar14;
      iVar18 = iVar15;
    } while (count != uVar17);
    *(int *)&_Var13._M_head_impl[0x21022]._vptr_BasicDsp = iVar20;
    *(int *)&_Var13._M_head_impl[0x21021]._vptr_BasicDsp = iVar14;
    *(int *)((long)(_Var13._M_head_impl + 0x21020) + 4) = iVar14;
    *(int *)((long)(_Var13._M_head_impl + 0x21021) + 4) = iVar20;
    *(int *)&_Var13._M_head_impl[0x54034]._vptr_BasicDsp = iVar19;
    *(int *)&_Var13._M_head_impl[0x54033]._vptr_BasicDsp = iVar15;
    *(int *)((long)(_Var13._M_head_impl + 0x54032) + 4) = iVar15;
    *(int *)((long)(_Var13._M_head_impl + 0x54033) + 4) = iVar19;
    *(int *)((long)(_Var13._M_head_impl + 6) + 4) = iVar12 + (int)uVar17;
  }
  return;
}

Assistant:

void Fverb::process(const float *in0, const float *in1, float *out0,
                    float *out1, unsigned count) noexcept
{

    mydsp &dsp = static_cast<mydsp &>(*fDsp);
    float *inputs[] = {
        const_cast<float *>(in0),
        const_cast<float *>(in1),
    };
    float *outputs[] = {
        out0,
        out1,
    };
    dsp.compute(count, inputs, outputs);
}